

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderErrorCode DecodeMetaBlockLength(BrotliDecoderStateInternal *s,BrotliBitReader *br)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint32_t uVar5;
  BrotliRunningMetablockHeaderState BVar6;
  ulong uVar7;
  uint uVar8;
  
  BVar6 = s->substate_metablock_header;
  do {
    switch(BVar6) {
    case BROTLI_STATE_METABLOCK_HEADER_NONE:
      uVar5 = br->bit_pos_;
      while (uVar5 == 0x40) {
        if (br->avail_in == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar7 = br->val_;
        br->val_ = uVar7 >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | uVar7 >> 8;
        br->bit_pos_ = 0x38;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
        uVar5 = 0x38;
      }
      br->bit_pos_ = uVar5 + 1;
      uVar3 = 1L << ((byte)uVar5 & 0x3f);
      uVar7 = br->val_;
      s->meta_block_remaining_len = 0;
      *(ushort *)&s->field_0x338 =
           (ushort)*(undefined4 *)&s->field_0x338 & 0xfff8 | (ushort)((uVar7 & uVar3) != 0);
      BVar6 = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      if ((uVar7 & uVar3) != 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        goto switchD_00102702_caseD_1;
      }
      goto LAB_001028a6;
    case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
switchD_00102702_caseD_1:
      uVar7 = (ulong)br->bit_pos_;
      while ((int)uVar7 == 0x40) {
        if (br->avail_in == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar7 = br->val_;
        br->val_ = uVar7 >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | uVar7 >> 8;
        br->bit_pos_ = 0x38;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
        uVar7 = 0x38;
      }
      uVar5 = (int)uVar7 + 1;
      br->bit_pos_ = uVar5;
      if ((br->val_ >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00102bf4;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
      uVar5 = br->bit_pos_;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_SIZE:
      uVar8 = s->loop_counter;
      uVar4 = (uint)*(ushort *)&s->field_0x338;
LAB_001029f8:
      while ((int)uVar8 < (int)(uVar4 >> 7 & 0xff)) {
        for (uVar5 = br->bit_pos_ + 4; uVar5 - 0x41 < 4; uVar5 = uVar5 - 8) {
          if (br->avail_in == 0) {
LAB_00102bad:
            s->loop_counter = uVar8;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar7 = br->val_;
          br->val_ = uVar7 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar7 >> 8;
          br->bit_pos_ = uVar5 - 0xc;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
        }
        uVar7 = br->val_ >> ((char)uVar5 - 4U & 0x3f);
        br->bit_pos_ = uVar5;
        uVar4 = *(uint *)&s->field_0x338;
        uVar2 = uVar4 >> 7 & 0xff;
        if (((uVar8 + 1 == uVar2) && (4 < (ushort)uVar2)) && ((uVar7 & 0xf) == 0)) {
          return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
        }
        s->meta_block_remaining_len =
             s->meta_block_remaining_len | ((uint)uVar7 & 0xf) << ((byte)(uVar8 << 2) & 0x1f);
        uVar8 = uVar8 + 1;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
LAB_0010290f:
      if ((uVar4 & 1) == 0) {
        uVar7 = (ulong)br->bit_pos_;
        while ((int)uVar7 == 0x40) {
          if (br->avail_in == 0) {
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar7 = br->val_;
          br->val_ = uVar7 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar7 >> 8;
          br->bit_pos_ = 0x38;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
          uVar7 = 0x38;
        }
        br->bit_pos_ = (int)uVar7 + 1;
        *(ushort *)&s->field_0x338 =
             ((ushort)*(undefined4 *)&s->field_0x338 & 0xfffd) +
             (ushort)((br->val_ >> (uVar7 & 0x3f) & 1) != 0) * 2;
      }
LAB_00102bee:
      s->meta_block_remaining_len = s->meta_block_remaining_len + 1;
LAB_00102bf4:
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
      return BROTLI_DECODER_SUCCESS;
    case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
      uVar4 = (uint)*(ushort *)&s->field_0x338;
      goto LAB_0010290f;
    case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
      uVar7 = (ulong)br->bit_pos_;
      while ((int)uVar7 == 0x40) {
        if (br->avail_in == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar7 = br->val_;
        br->val_ = uVar7 >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | uVar7 >> 8;
        br->bit_pos_ = 0x38;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
        uVar7 = 0x38;
      }
      uVar5 = (int)uVar7 + 1;
      br->bit_pos_ = uVar5;
      if ((br->val_ >> (uVar7 & 0x3f) & 1) != 0) {
        return BROTLI_DECODER_ERROR_FORMAT_RESERVED;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
LAB_0010297c:
      for (uVar5 = uVar5 + 2; uVar5 - 0x41 < 2; uVar5 = uVar5 - 8) {
        if (br->avail_in == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar7 = br->val_;
        br->val_ = uVar7 >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | uVar7 >> 8;
        br->bit_pos_ = uVar5 - 10;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
      }
      uVar7 = br->val_ >> ((char)uVar5 - 2U & 0x3f);
      br->bit_pos_ = uVar5;
      if ((uVar7 & 3) == 0) goto LAB_00102bf4;
      uVar4 = *(uint *)&s->field_0x338 & 0xffff807f | ((uint)uVar7 & 3) << 7;
      *(short *)&s->field_0x338 = (short)uVar4;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
LAB_00102aea:
      uVar8 = s->loop_counter;
      while ((int)uVar8 < (int)(uVar4 >> 7 & 0xff)) {
        for (uVar5 = br->bit_pos_ + 8; uVar5 - 0x41 < 8; uVar5 = uVar5 - 8) {
          if (br->avail_in == 0) goto LAB_00102bad;
          uVar7 = br->val_;
          br->val_ = uVar7 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar7 >> 8;
          br->bit_pos_ = uVar5 - 0x10;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
        }
        uVar7 = br->val_ >> ((char)uVar5 - 8U & 0x3f);
        br->bit_pos_ = uVar5;
        uVar4 = *(uint *)&s->field_0x338;
        uVar2 = uVar4 >> 7 & 0xff;
        if (((uVar8 + 1 == uVar2) && (1 < (ushort)uVar2)) && ((uVar7 & 0xff) == 0)) {
          return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE;
        }
        s->meta_block_remaining_len =
             s->meta_block_remaining_len | ((uint)uVar7 & 0xff) << ((byte)(uVar8 << 3) & 0x1f);
        uVar8 = uVar8 + 1;
      }
      goto LAB_00102bee;
    case BROTLI_STATE_METABLOCK_HEADER_BYTES:
      uVar5 = br->bit_pos_;
      goto LAB_0010297c;
    case BROTLI_STATE_METABLOCK_HEADER_METADATA:
      uVar4 = (uint)*(ushort *)&s->field_0x338;
      goto LAB_00102aea;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
    for (uVar5 = uVar5 + 2; uVar5 - 0x41 < 2; uVar5 = uVar5 - 8) {
      if (br->avail_in == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar7 = br->val_;
      br->val_ = uVar7 >> 8;
      br->val_ = (ulong)*br->next_in << 0x38 | uVar7 >> 8;
      br->bit_pos_ = uVar5 - 10;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
    }
    uVar2 = (uint)(br->val_ >> ((char)uVar5 - 2U & 0x3f)) & 3;
    br->bit_pos_ = uVar5;
    iVar1 = uVar2 * 0x80;
    uVar8 = *(uint *)&s->field_0x338 & 0xffff807f;
    uVar4 = iVar1 + uVar8 + 0x200;
    *(short *)&s->field_0x338 = (short)uVar4;
    s->loop_counter = 0;
    if (uVar2 != 3) {
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
      uVar8 = 0;
      goto LAB_001029f8;
    }
    *(ushort *)&s->field_0x338 = (ushort)iVar1 | (ushort)uVar8 | 0x204;
    BVar6 = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
LAB_001028a6:
    s->substate_metablock_header = BVar6;
  } while( true );
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE DecodeMetaBlockLength(
    BrotliDecoderState* s, BrotliBitReader* br) {
  uint32_t bits;
  int i;
  for (;;) {
    switch (s->substate_metablock_header) {
      case BROTLI_STATE_METABLOCK_HEADER_NONE:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->is_last_metablock = bits ? 1 : 0;
        s->meta_block_remaining_len = 0;
        s->is_uncompressed = 0;
        s->is_metadata = 0;
        if (!s->is_last_metablock) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
          break;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
      /* Fall through. */

      case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      /* Fall through. */

      case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
        if (!BrotliSafeReadBits(br, 2, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->size_nibbles = (uint8_t)(bits + 4);
        s->loop_counter = 0;
        if (bits == 3) {
          s->is_metadata = 1;
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
          break;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
      /* Fall through. */

      case BROTLI_STATE_METABLOCK_HEADER_SIZE:
        i = s->loop_counter;
        for (; i < (int)s->size_nibbles; ++i) {
          if (!BrotliSafeReadBits(br, 4, &bits)) {
            s->loop_counter = i;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 4 &&
              bits == 0) {
            return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE);
          }
          s->meta_block_remaining_len |= (int)(bits << (i * 4));
        }
        s->substate_metablock_header =
            BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
      /* Fall through. */

      case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
        if (!s->is_last_metablock) {
          if (!BrotliSafeReadBits(br, 1, &bits)) {
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          s->is_uncompressed = bits ? 1 : 0;
        }
        ++s->meta_block_remaining_len;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;

      case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits != 0) {
          return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_RESERVED);
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
      /* Fall through. */

      case BROTLI_STATE_METABLOCK_HEADER_BYTES:
        if (!BrotliSafeReadBits(br, 2, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits == 0) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        s->size_nibbles = (uint8_t)bits;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
      /* Fall through. */

      case BROTLI_STATE_METABLOCK_HEADER_METADATA:
        i = s->loop_counter;
        for (; i < (int)s->size_nibbles; ++i) {
          if (!BrotliSafeReadBits(br, 8, &bits)) {
            s->loop_counter = i;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 1 &&
              bits == 0) {
            return BROTLI_FAILURE(
                BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE);
          }
          s->meta_block_remaining_len |= (int)(bits << (i * 8));
        }
        ++s->meta_block_remaining_len;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;

      default:
        return
            BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
    }
  }
}